

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcUShapeProfileDef::~IfcUShapeProfileDef(IfcUShapeProfileDef *this)

{
  undefined1 *puVar1;
  bool *pbVar2;
  
  this[-1].FlangeWidth = 4.55604809201347e-317;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x8cb5d0;
  puVar1 = *(undefined1 **)&this[-1].EdgeRadius.have;
  pbVar2 = &this[-1].FlangeSlope.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  pbVar2 = &this[-1].FilletRadius.have;
  if ((bool *)this[-1].FlangeThickness != pbVar2) {
    operator_delete((undefined1 *)this[-1].FlangeThickness,*(long *)pbVar2 + 1);
  }
  operator_delete(&this[-1].FlangeWidth,0xf8);
  return;
}

Assistant:

IfcUShapeProfileDef() : Object("IfcUShapeProfileDef") {}